

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_passphrase.c
# Opt level: O1

int set_passphrase(archive_write *a,char *p)

{
  int iVar1;
  char *pcVar2;
  
  if ((p == (char *)0x0) || (*p == '\0')) {
    archive_set_error(&a->archive,-1,"Empty passphrase is unacceptable");
    iVar1 = -0x19;
  }
  else {
    free(a->passphrase);
    pcVar2 = strdup(p);
    a->passphrase = pcVar2;
    iVar1 = 0;
    if (pcVar2 == (char *)0x0) {
      archive_set_error(&a->archive,0xc,"Can\'t allocate data for passphrase");
      iVar1 = -0x1e;
    }
  }
  return iVar1;
}

Assistant:

static int
set_passphrase(struct archive_write *a, const char *p)
{
	if (p == NULL || p[0] == '\0') {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Empty passphrase is unacceptable");
		return (ARCHIVE_FAILED);
	}
	free(a->passphrase);
	a->passphrase = strdup(p);
	if (a->passphrase == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate data for passphrase");
		return (ARCHIVE_FATAL);
	}
	return (ARCHIVE_OK);
}